

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer pCVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  DNA *__x;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  key_type *__k;
  uint uVar7;
  Class *class_;
  pointer pCVar8;
  undefined1 *puVar9;
  _Base_ptr *this;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  long lVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<Teacher> __l_00;
  initializer_list<Room> __l_01;
  initializer_list<Subject> __l_02;
  initializer_list<Group> __l_03;
  Day *mainDay;
  vector<Teacher,_std::allocator<Teacher>_> teachers;
  vector<Subject,_std::allocator<Subject>_> subjects;
  vector<Room,_std::allocator<Room>_> rooms;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  days;
  Population population;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  schedule;
  DataStorage data;
  vector<Group,_std::allocator<Group>_> groups;
  vector<Teacher,_std::allocator<Teacher>_> local_700;
  char *local_6e8;
  size_type local_6e0;
  char local_6d8;
  undefined7 uStack_6d7;
  pointer pTStack_6d0;
  undefined1 *local_6c8;
  undefined8 local_6c0;
  undefined1 local_6b8;
  undefined7 uStack_6b7;
  undefined8 uStack_6b0;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined1 local_698;
  undefined7 uStack_697;
  undefined8 uStack_690;
  _Rb_tree_node_base *local_688;
  undefined8 local_680;
  undefined1 local_678 [16];
  _Base_ptr local_668;
  _Base_ptr local_660;
  undefined1 local_658 [16];
  pointer local_648;
  _Base_ptr local_640;
  undefined1 local_638 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  undefined1 local_618;
  uint7 uStack_617;
  _Base_ptr p_Stack_610;
  pointer local_608;
  pointer local_600;
  undefined1 local_5f8 [16];
  uint *local_5e8;
  size_type local_5e0;
  uint local_5d8;
  undefined4 uStack_5d4;
  _Base_ptr *local_5c8;
  undefined8 local_5c0;
  uint local_5b8;
  undefined4 uStack_5b4;
  _Base_ptr local_5a8;
  _Base_ptr local_5a0;
  undefined1 local_598 [16];
  pointer local_588;
  pointer local_580;
  undefined1 local_578 [16];
  uint *local_568;
  pointer local_560;
  uint local_558;
  undefined4 uStack_554;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538;
  undefined7 uStack_537;
  _Base_ptr p_Stack_530;
  _Base_ptr local_528;
  size_t local_520;
  undefined1 local_518 [16];
  _Rb_tree_node_base *local_508;
  undefined8 local_500;
  undefined1 local_4f8 [16];
  _Rb_tree_node_base *local_4e8;
  _Base_ptr local_4e0;
  undefined1 local_4d8 [16];
  _Rb_tree_node_base *local_4c8;
  _Base_ptr local_4c0;
  undefined1 local_4b8 [16];
  pointer local_4a8;
  pointer local_4a0;
  undefined1 local_498 [16];
  _Base_ptr *local_488;
  undefined8 local_480;
  uint local_478;
  undefined4 uStack_474;
  vector<Subject,_std::allocator<Subject>_> local_468;
  vector<Subject,_std::allocator<Subject>_> local_448;
  vector<Subject,_std::allocator<Subject>_> local_428;
  vector<Teacher,_std::allocator<Teacher>_> local_408;
  vector<Teacher,_std::allocator<Teacher>_> local_3e8;
  vector<Teacher,_std::allocator<Teacher>_> local_3c8;
  vector<Teacher,_std::allocator<Teacher>_> local_3a8;
  vector<Teacher,_std::allocator<Teacher>_> local_388;
  vector<Teacher,_std::allocator<Teacher>_> local_368;
  vector<Teacher,_std::allocator<Teacher>_> local_348;
  vector<Teacher,_std::allocator<Teacher>_> local_328;
  vector<Teacher,_std::allocator<Teacher>_> local_308;
  vector<Subject,_std::allocator<Subject>_> local_2e8;
  vector<Room,_std::allocator<Room>_> local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [20];
  undefined4 uStack_28c;
  undefined1 auStack_288 [8];
  undefined4 local_280;
  undefined4 uStack_27c;
  pointer pSStack_278;
  undefined1 local_270 [8];
  pointer pSStack_268;
  _Base_ptr local_260;
  undefined1 local_258 [16];
  size_t sStack_248;
  _Rb_tree_node_base _Stack_240;
  undefined1 local_220 [16];
  pointer local_210 [3];
  _Base_ptr local_1f8;
  _Base_ptr p_Stack_1f0;
  pointer pSStack_1e8;
  pointer pSStack_1e0;
  pointer local_1d8;
  undefined1 auStack_1d0 [16];
  _Rb_tree_node_base *local_1c0 [2];
  _Rb_tree_node_base local_1b0;
  pointer local_190;
  undefined1 *local_188;
  undefined8 local_180;
  undefined1 local_178 [8];
  undefined8 uStack_170;
  pointer local_168;
  pointer pTStack_160;
  pointer local_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [8];
  undefined8 uStack_138;
  pointer local_130;
  pointer pTStack_128;
  pointer local_120;
  _Rb_tree_node_base *local_118;
  _Base_ptr local_110;
  _Rb_tree_node_base local_108;
  pointer local_e8;
  _Rb_tree_node_base *local_e0;
  undefined8 local_d8;
  _Rb_tree_node_base local_d0;
  pointer local_b0;
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  local_a8;
  DataStorage local_78;
  vector<Group,_std::allocator<Group>_> local_48;
  
  local_2a0._0_8_ = local_2a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"Monday","");
  _local_280 = (pointer)local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Tuesday","");
  local_260 = (_Base_ptr)(local_258 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"Wednesday","");
  _Stack_240._0_8_ = &_Stack_240._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_240,"Thursday","");
  puVar9 = (undefined1 *)local_210;
  local_220._0_8_ = puVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Friday","");
  __l._M_len = 5;
  __l._M_array = (iterator)local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b8,__l,(allocator_type *)&local_78);
  lVar12 = -0xa0;
  do {
    if (puVar9 != *(undefined1 **)(puVar9 + 0xfffffffffffffff0)) {
      operator_delete(*(undefined1 **)(puVar9 + 0xfffffffffffffff0),*(long *)puVar9 + 1);
    }
    puVar9 = puVar9 + 0xffffffffffffffe0;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  local_568 = &local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Merk","");
  local_2a0._0_8_ = local_2a0 + 0x10;
  if (local_568 != &local_558) {
    local_2a0._0_8_ = local_568;
  }
  uStack_28c = uStack_554;
  local_2a0._16_4_ = local_558;
  local_2a0._8_8_ = local_560;
  local_560 = (pointer)0x0;
  local_558 = local_558 & 0xffffff00;
  local_588 = (pointer)local_578;
  local_568 = &local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"Margo","");
  _local_280 = (pointer)local_270;
  if (local_588 != (pointer)local_578) {
    _local_280 = local_588;
  }
  local_270._4_4_ = local_578._4_4_;
  local_270._0_4_ = local_578._0_4_;
  pSStack_278 = local_580;
  local_580 = (pointer)0x0;
  local_578._0_4_ = local_578._0_4_ & 0xffffff00;
  local_5a8 = (_Base_ptr)local_598;
  local_588 = (pointer)local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Fish","");
  local_260 = (_Base_ptr)(local_258 + 8);
  if (local_5a8 != (_Base_ptr)local_598) {
    local_260 = local_5a8;
  }
  local_258._12_4_ = local_598._4_4_;
  local_258._8_4_ = local_598._0_4_;
  local_258._0_8_ = local_5a0;
  local_5a0 = (_Base_ptr)0x0;
  local_598._0_4_ = local_598._0_4_ & 0xffffff00;
  local_5c8 = (_Base_ptr *)&local_5b8;
  local_5a8 = (_Base_ptr)local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"Roma","");
  _Stack_240._0_8_ = &_Stack_240._M_left;
  if (local_5c8 != (_Base_ptr *)&local_5b8) {
    _Stack_240._0_8_ = local_5c8;
  }
  _Stack_240._M_parent = (_Base_ptr)local_5c0;
  local_5c0 = 0;
  local_5b8 = local_5b8 & 0xffffff00;
  local_5e8 = &local_5d8;
  local_5c8 = (_Base_ptr *)&local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Pokemon","");
  local_220._0_8_ = local_210;
  if (local_5e8 != &local_5d8) {
    local_220._0_8_ = local_5e8;
  }
  local_220._8_8_ = local_5e0;
  local_5e0 = 0;
  local_5d8 = local_5d8 & 0xffffff00;
  local_5e8 = &local_5d8;
  local_488 = (_Base_ptr *)&local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Biba","");
  local_210[2] = (pointer)&p_Stack_1f0;
  if (local_488 != (_Base_ptr *)&local_478) {
    local_210[2] = (pointer)local_488;
  }
  local_1f8 = (_Base_ptr)local_480;
  local_480 = 0;
  local_478 = local_478 & 0xffffff00;
  local_4a8 = (pointer)local_498;
  local_488 = (_Base_ptr *)&local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Nika","");
  pSStack_1e0 = (pointer)auStack_1d0;
  if (local_4a8 != (pointer)local_498) {
    pSStack_1e0 = local_4a8;
  }
  local_1d8 = local_4a0;
  local_4a0 = (pointer)0x0;
  local_498._0_4_ = local_498._0_4_ & 0xffffff00;
  local_4c8 = (_Rb_tree_node_base *)local_4b8;
  local_4a8 = (pointer)local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Vlad","");
  p_Var10 = &local_1b0;
  if (local_4c8 == (_Rb_tree_node_base *)local_4b8) {
    local_1b0._M_parent = (_Base_ptr)local_4b8._8_8_;
    local_1c0[0] = p_Var10;
  }
  else {
    local_1c0[0] = local_4c8;
  }
  local_1c0[1] = local_4c0;
  local_4c0 = (_Base_ptr)0x0;
  local_4b8[0] = _S_red;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_2a0;
  local_4c8 = (_Rb_tree_node_base *)local_4b8;
  std::vector<Teacher,_std::allocator<Teacher>_>::vector
            (&local_700,__l_00,(allocator_type *)&local_78);
  lVar12 = -0x100;
  do {
    if (p_Var10 != p_Var10[-1]._M_left) {
      operator_delete(p_Var10[-1]._M_left,*(long *)p_Var10 + 1);
    }
    p_Var10 = p_Var10 + -1;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  if (local_4c8 != (_Rb_tree_node_base *)local_4b8) {
    operator_delete(local_4c8,CONCAT71(local_4b8._1_7_,local_4b8[0]) + 1);
  }
  if (local_4a8 != (pointer)local_498) {
    operator_delete(local_4a8,CONCAT44(local_498._4_4_,local_498._0_4_) + 1);
  }
  if (local_488 != (_Base_ptr *)&local_478) {
    operator_delete(local_488,CONCAT44(uStack_474,local_478) + 1);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8,CONCAT44(uStack_5d4,local_5d8) + 1);
  }
  if (local_5c8 != (_Base_ptr *)&local_5b8) {
    operator_delete(local_5c8,CONCAT44(uStack_5b4,local_5b8) + 1);
  }
  if (local_5a8 != (_Base_ptr)local_598) {
    operator_delete(local_5a8,CONCAT44(local_598._4_4_,local_598._0_4_) + 1);
  }
  if (local_588 != (pointer)local_578) {
    operator_delete(local_588,CONCAT44(local_578._4_4_,local_578._0_4_) + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT44(uStack_554,local_558) + 1);
  }
  local_2a0._0_4_ = 0xd7;
  local_2a0._8_8_ = (pointer)0x1e;
  local_2a0._16_4_ = 0x1f9;
  auStack_288 = (undefined1  [8])0x23;
  local_280 = 1;
  pSStack_278 = (pointer)0x1b;
  local_270._0_4_ = 0x27;
  pSStack_268 = (pointer)0x64;
  local_260 = (_Base_ptr)CONCAT44(local_260._4_4_,0x12f);
  local_258._0_8_ = (_Base_ptr)0x19;
  local_258._8_4_ = 0x1b;
  sStack_248 = 0x23;
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)local_2a0;
  std::vector<Room,_std::allocator<Room>_>::vector(&local_2d0,__l_01,(allocator_type *)&local_78);
  local_608 = (pointer)local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"Algebra","");
  GetRandomSubsetOfTeachers(&local_308,&local_700);
  if (local_608 == (pointer)local_5f8) {
    auStack_288 = (undefined1  [8])local_5f8._8_8_;
    local_2a0._0_8_ = local_2a0 + 0x10;
  }
  else {
    local_2a0._0_8_ = local_608;
  }
  local_2a0._8_8_ = local_600;
  local_600 = (pointer)0x0;
  local_5f8[0] = '\0';
  _local_280 = local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
               super__Vector_impl_data._M_start;
  pSStack_278 = (pointer)local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                         super__Vector_impl_data._M_finish;
  local_270 = (undefined1  [8])
              local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar9 = local_638 + 0x20;
  local_628._M_allocated_capacity = (size_type)puVar9;
  local_608 = (pointer)local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_638 + 0x10),"Geometry","");
  GetRandomSubsetOfTeachers(&local_328,&local_700);
  pSStack_268 = (pointer)local_258;
  if ((undefined1 *)local_628._M_allocated_capacity == puVar9) {
    local_258._8_8_ = p_Stack_610;
  }
  else {
    pSStack_268 = (pointer)local_628._M_allocated_capacity;
  }
  local_258._0_8_ = (ulong)uStack_617 << 8;
  local_260 = (_Base_ptr)local_628._8_8_;
  local_628._8_8_ = 0;
  local_618 = 0;
  sStack_248 = (size_t)local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                       super__Vector_impl_data._M_start;
  _Stack_240._0_8_ =
       local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  _Stack_240._M_parent =
       (_Base_ptr)
       local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_648 = (pointer)local_638;
  local_628._M_allocated_capacity = (size_type)puVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"Programming","");
  GetRandomSubsetOfTeachers(&local_348,&local_700);
  _Stack_240._M_left = (_Base_ptr)local_220;
  if (local_648 == (pointer)local_638) {
    local_220._8_8_ = local_638._8_8_;
  }
  else {
    _Stack_240._M_left = (_Base_ptr)local_648;
  }
  _Stack_240._M_right = local_640;
  local_640 = (_Base_ptr)0x0;
  local_638[0] = 0;
  local_210[0] = local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_210[1] = local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  local_210[2] = local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_668 = (_Base_ptr)local_658;
  local_648 = (pointer)local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"Discrete Math","");
  GetRandomSubsetOfTeachers(&local_368,&local_700);
  p_Var6 = (_Base_ptr)&pSStack_1e8;
  if (local_668 == (_Base_ptr)local_658) {
    pSStack_1e0 = (pointer)local_658._8_8_;
    local_1f8 = p_Var6;
  }
  else {
    local_1f8 = local_668;
  }
  p_Stack_1f0 = local_660;
  local_660 = (_Base_ptr)0x0;
  local_658[0] = _S_red;
  local_1d8 = (pointer)local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                       super__Vector_impl_data._M_start;
  auStack_1d0._0_8_ =
       local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  auStack_1d0._8_8_ =
       local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_688 = (_Rb_tree_node_base *)local_678;
  local_668 = (_Base_ptr)local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"DataStorage science","");
  GetRandomSubsetOfTeachers(&local_388,&local_700);
  local_1c0[0] = &local_1b0;
  if (local_688 == (_Rb_tree_node_base *)local_678) {
    local_1b0._M_parent = (_Base_ptr)local_678._8_8_;
  }
  else {
    local_1c0[0] = local_688;
  }
  local_1c0[1] = (_Rb_tree_node_base *)local_680;
  local_680 = 0;
  local_678[0] = _S_red;
  local_1b0._M_left =
       (_Base_ptr)
       local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1b0._M_right =
       (_Base_ptr)
       local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_190 = local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6a8 = &local_698;
  local_688 = (_Rb_tree_node_base *)local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"DataStorage structures","");
  GetRandomSubsetOfTeachers(&local_3a8,&local_700);
  local_188 = local_178;
  if (local_6a8 == &local_698) {
    uStack_170 = uStack_690;
  }
  else {
    local_188 = local_6a8;
  }
  local_180 = local_6a0;
  local_6a0 = 0;
  local_698 = 0;
  local_168 = local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_start;
  pTStack_160 = local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_158 = local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6c8 = &local_6b8;
  local_6a8 = &local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"Math Anal.","");
  GetRandomSubsetOfTeachers(&local_3c8,&local_700);
  local_150 = local_140;
  if (local_6c8 == &local_6b8) {
    uStack_138 = uStack_6b0;
  }
  else {
    local_150 = local_6c8;
  }
  local_148 = local_6c0;
  local_6c0 = 0;
  local_6b8 = 0;
  local_130 = local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_start;
  pTStack_128 = local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_120 = local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6c8 = &local_6b8;
  local_4e8 = (_Rb_tree_node_base *)local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Prob. Th.","");
  GetRandomSubsetOfTeachers(&local_3e8,&local_700);
  local_118 = &local_108;
  if (local_4e8 == (_Rb_tree_node_base *)local_4d8) {
    local_108._M_parent = (_Base_ptr)local_4d8._8_8_;
  }
  else {
    local_118 = local_4e8;
  }
  local_110 = local_4e0;
  local_4e0 = (_Base_ptr)0x0;
  local_4d8[0] = _S_red;
  local_108._M_left =
       (_Base_ptr)
       local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_108._M_right =
       (_Base_ptr)
       local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_e8 = local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_508 = (_Rb_tree_node_base *)local_4f8;
  local_4e8 = (_Rb_tree_node_base *)local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"Algorithms","");
  GetRandomSubsetOfTeachers(&local_408,&local_700);
  local_e0 = &local_d0;
  if (local_508 == (_Rb_tree_node_base *)local_4f8) {
    local_d0._M_parent = (_Base_ptr)local_4f8._8_8_;
  }
  else {
    local_e0 = local_508;
  }
  local_d8 = local_500;
  local_500 = 0;
  local_4f8[0] = _S_red;
  local_d0._M_left =
       (_Base_ptr)
       local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_d0._M_right =
       (_Base_ptr)
       local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b0 = local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __l_02._M_len = 9;
  __l_02._M_array = (iterator)local_2a0;
  local_508 = (_Rb_tree_node_base *)local_4f8;
  std::vector<Subject,_std::allocator<Subject>_>::vector
            (&local_2e8,__l_02,(allocator_type *)&local_78);
  lVar12 = -0x1f8;
  this = &local_d0._M_left;
  do {
    std::vector<Teacher,_std::allocator<Teacher>_>::~vector
              ((vector<Teacher,_std::allocator<Teacher>_> *)this);
    if ((_Rb_tree_node_base *)(this + -2) != this[-4]) {
      operator_delete(this[-4],*(long *)(this + -2) + 1);
    }
    this = this + -7;
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_408);
  if (local_508 != (_Rb_tree_node_base *)local_4f8) {
    operator_delete(local_508,CONCAT71(local_4f8._1_7_,local_4f8[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3e8);
  if (local_4e8 != (_Rb_tree_node_base *)local_4d8) {
    operator_delete(local_4e8,CONCAT71(local_4d8._1_7_,local_4d8[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3c8);
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8,CONCAT71(uStack_6b7,local_6b8) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3a8);
  if (local_6a8 != &local_698) {
    operator_delete(local_6a8,CONCAT71(uStack_697,local_698) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_388);
  if (local_688 != (_Rb_tree_node_base *)local_678) {
    operator_delete(local_688,CONCAT71(local_678._1_7_,local_678[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_368);
  if (local_668 != (_Base_ptr)local_658) {
    operator_delete(local_668,CONCAT71(local_658._1_7_,local_658[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_348);
  if (local_648 != (pointer)local_638) {
    operator_delete(local_648,CONCAT71(local_638._1_7_,local_638[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_328);
  if ((undefined1 *)local_628._M_allocated_capacity != local_638 + 0x20) {
    operator_delete((void *)local_628._M_allocated_capacity,CONCAT71(uStack_617,local_618) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_308);
  if (local_608 != (pointer)local_5f8) {
    operator_delete(local_608,CONCAT71(local_5f8._1_7_,local_5f8[0]) + 1);
  }
  local_6e8 = &local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"TTP-42","");
  GetRandomSubsetOfSubjects(&local_428,&local_2e8);
  local_2a0._8_8_ = auStack_288;
  local_2a0._0_4_ = Group::counter;
  if (local_6e8 == &local_6d8) {
    _local_280 = pTStack_6d0;
  }
  else {
    local_2a0._8_8_ = local_6e8;
  }
  stack0xfffffffffffffd70 = local_6e0;
  local_6e0 = 0;
  local_6d8 = '\0';
  pSStack_278 = local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_270 = (undefined1  [8])
              local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pSStack_268 = local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_260 = (_Base_ptr)0x14;
  Group::counter = Group::counter + 1;
  local_6e8 = &local_6d8;
  local_528 = (_Base_ptr)local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"TTP-41","");
  GetRandomSubsetOfSubjects(&local_448,&local_2e8);
  local_258._8_8_ = &_Stack_240;
  local_258._0_4_ = Group::counter;
  if (local_528 == (_Base_ptr)local_518) {
    _Stack_240._M_parent = (_Base_ptr)local_518._8_8_;
  }
  else {
    local_258._8_8_ = local_528;
  }
  sStack_248 = local_520;
  local_520 = 0;
  local_518[0] = 0;
  _Stack_240._M_left =
       (_Base_ptr)
       local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Stack_240._M_right =
       (_Base_ptr)
       local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_220._0_8_ =
       local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_220._8_8_ = 0x1e;
  Group::counter = Group::counter + 1;
  local_548 = &local_538;
  local_528 = (_Base_ptr)local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"MI-4","");
  GetRandomSubsetOfSubjects(&local_468,&local_2e8);
  local_210[1] = (pointer)((long)local_210 + 0x18);
  local_210[0] = (pointer)CONCAT44(local_210[0]._4_4_,Group::counter);
  if (local_548 == &local_538) {
    p_Stack_1f0 = p_Stack_530;
  }
  else {
    local_210[1] = (pointer)local_548;
  }
  local_210[2] = (pointer)local_540;
  local_540 = 0;
  local_538 = 0;
  pSStack_1e8 = local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_start;
  pSStack_1e0 = local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_1d8 = local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auStack_1d0._0_8_ = 0x1a;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_2a0;
  Group::counter = Group::counter + 1;
  local_548 = &local_538;
  std::vector<Group,_std::allocator<Group>_>::vector(&local_48,__l_03,(allocator_type *)&local_78);
  lVar12 = -0xd8;
  do {
    std::vector<Subject,_std::allocator<Subject>_>::~vector
              ((vector<Subject,_std::allocator<Subject>_> *)p_Var6);
    if ((pointer)((long)(p_Var6 + 0xffffffffffffffff) + 0x10U) !=
        *(pointer *)
         &((_Vector_base<Subject,_std::allocator<Subject>_> *)(p_Var6 + 0xffffffffffffffff))->
          _M_impl) {
      operator_delete(*(pointer *)
                       &((_Vector_base<Subject,_std::allocator<Subject>_> *)
                        (p_Var6 + 0xffffffffffffffff))->_M_impl,
                      (ulong)((long)&(*(pointer *)
                                       &((_Vector_base<Subject,_std::allocator<Subject>_> *)
                                        ((long)(p_Var6 + 0xffffffffffffffff) + 0x10U))->_M_impl)->
                                     name + 1));
    }
    p_Var6 = (_Base_ptr)((long)(p_Var6 + 0xfffffffffffffffd) + 0x18);
    lVar12 = lVar12 + 0x48;
  } while (lVar12 != 0);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_468);
  if (local_548 != &local_538) {
    operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
  }
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_448);
  if (local_528 != (_Base_ptr)local_518) {
    operator_delete(local_528,CONCAT71(local_518._1_7_,local_518[0]) + 1);
  }
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_428);
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8,CONCAT71(uStack_6d7,local_6d8) + 1);
  }
  local_78.rooms = &local_2d0;
  local_78.teachers = &local_700;
  local_78.LESSONS_PER_DAY = 4;
  local_78.groups = &local_48;
  local_78.subjects = &local_2e8;
  local_78.days = &local_2b8;
  Population::Population((Population *)local_2a0,&local_78,0.02,0x32);
  uVar11 = 1;
  uVar7 = 0;
  while (bVar2 = Population::AnswerReady((Population *)local_2a0), !bVar2 && uVar7 < 5000000) {
    Population::evolve((Population *)local_2a0);
    if ((int)(uVar11 / 100) * 100 - 1U == uVar7) {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar7 + 1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
    uVar11 = (ulong)((int)uVar11 + 1);
    uVar7 = uVar7 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"population size = ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mutation rate = ",0x10);
  poVar4 = std::ostream::_M_insert<double>(0.02);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iterations = ",0xd);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"answer is ready = ",0x12);
  Population::AnswerReady((Population *)local_2a0);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n\n",3);
  __x = Population::GetAnswer((Population *)local_2a0);
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::_Rb_tree(&local_a8,
             (_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
              *)__x);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=================================\n",0x22);
  for (__k = local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Day: ",6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(__k->_M_dataplus)._M_p,__k->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
    for (p_Var6 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_a8._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
                             *)&p_Var6[3]._M_parent,__k);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Group: ",9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)p_Var6[1]._M_parent,(long)p_Var6[1]._M_left)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      pCVar1 = (pmVar5->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar8 = (pmVar5->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                    super__Vector_impl_data._M_start; pCVar8 != pCVar1; pCVar8 = pCVar8 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  room = ",9);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pCVar8->room).number);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  lesson = ",0xb);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pCVar8->subject).name._M_dataplus._M_p,
                            (pCVar8->subject).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  teacher = ",0xc)
        ;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pCVar8->teacher).name._M_dataplus._M_p,
                            (pCVar8->teacher).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  --------------------\n",0x17);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"=================================\n",0x22);
  }
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_a8);
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
               *)local_270);
  std::vector<DNA,_std::allocator<DNA>_>::~vector
            ((vector<DNA,_std::allocator<DNA>_> *)(local_2a0 + 8));
  std::vector<Group,_std::allocator<Group>_>::~vector(&local_48);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_2e8);
  if (local_2d0.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d0.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d0.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_700);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  return 0;
}

Assistant:

int main() {
    vector<Day> days = {"Monday", "Tuesday", "Wednesday", "Thursday", "Friday"}; // 5
    vector<Teacher> teachers = {
            Teacher("Merk"),
            Teacher("Margo"),
            Teacher("Fish"),
            Teacher("Roma"),
            Teacher("Pokemon"),
            Teacher("Biba"),
            Teacher("Nika"),
            Teacher("Vlad"),
    }; // 8
    vector<Room> rooms = {
            Room(215, 30),
            Room(505, 35),
            Room(1, 27),
            Room(39, 100),
            Room(303, 25),
            Room(27, 35),
    }; // 6
    vector<Subject> subjects = {
            Subject("Algebra", GetRandomSubsetOfTeachers(teachers)),
            Subject("Geometry", GetRandomSubsetOfTeachers(teachers)),
            Subject("Programming", GetRandomSubsetOfTeachers(teachers)),
            Subject("Discrete Math", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage science", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage structures", GetRandomSubsetOfTeachers(teachers)),
            Subject("Math Anal.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Prob. Th.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Algorithms", GetRandomSubsetOfTeachers(teachers)),
    }; // 9
    vector<Group> groups = {
            Group("TTP-42", GetRandomSubsetOfSubjects(subjects), 20),
            Group("TTP-41", GetRandomSubsetOfSubjects(subjects), 30),
            Group("MI-4", GetRandomSubsetOfSubjects(subjects), 26),
    };

    DataStorage data(groups, subjects, rooms, teachers, days, LESSONS_PER_DAY);

    Population population(data, MUTATION_RATE, POPULATION_SIZE);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < EVOLUTION_MAX_ITERATIONS) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << endl;
        }
    }

    cout << "population size = " << POPULATION_SIZE << "\n";
    cout << "mutation rate = " << MUTATION_RATE << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n\n\n";

    auto schedule = population.GetAnswer().schedule.schedule;

    cout << "=================================\n";

    for (const Day& mainDay : days) {
        cout << "[Day: " << mainDay << "]\n";

        for (auto&[group, schedulePerGroup] : schedule) {
            auto& listOfClasses = schedulePerGroup[mainDay];
            cout << "  Group: " << group.name << "\n";
            for (Class& class_ : listOfClasses) {
                cout << "  " << class_.time.number + 1 << ")\n";
                cout << "  room = " << class_.room.number << "\n";
                cout << "  lesson = " << class_.subject.name << "\n";
                cout << "  teacher = " << class_.teacher.name << "\n";
            }
            cout << "  --------------------\n";
        }
        cout << "=================================\n";
    }

    return 0;
}